

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

void __thiscall cmTestGenerator::GenerateInternalProperties(cmTestGenerator *this,ostream *os)

{
  bool bVar1;
  cmListFileBacktrace *pcVar2;
  ostream *poVar3;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_58;
  cmListFileContext *local_48;
  cmListFileContext *entry;
  undefined4 local_38;
  bool prependTripleSeparator;
  undefined1 local_28 [8];
  cmListFileBacktrace bt;
  ostream *os_local;
  cmTestGenerator *this_local;
  
  bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)os;
  pcVar2 = cmTest::GetBacktrace(this->Test);
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_28,pcVar2);
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_28);
  if (bVar1) {
    local_38 = 1;
  }
  else {
    poVar3 = std::operator<<((ostream *)
                             bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi," ");
    poVar3 = std::operator<<(poVar3,"_BACKTRACE_TRIPLES");
    std::operator<<(poVar3," \"");
    entry._7_1_ = 0;
    while( true ) {
      bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                        ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_28);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_48 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                           ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_28);
      if ((entry._7_1_ & 1) != 0) {
        std::operator<<((ostream *)
                        bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi,";");
      }
      poVar3 = std::operator<<((ostream *)
                               bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                               TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi,(string *)&local_48->FilePath);
      poVar3 = std::operator<<(poVar3,";");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_48->Line);
      poVar3 = std::operator<<(poVar3,";");
      std::operator<<(poVar3,(string *)local_48);
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop(&local_58);
      cmListFileBacktrace::operator=
                ((cmListFileBacktrace *)local_28,(cmListFileBacktrace *)&local_58);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_58);
      entry._7_1_ = 1;
    }
    std::operator<<((ostream *)
                    bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi,'\"');
    local_38 = 0;
  }
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_28);
  return;
}

Assistant:

void cmTestGenerator::GenerateInternalProperties(std::ostream& os)
{
  cmListFileBacktrace bt = this->Test->GetBacktrace();
  if (bt.Empty()) {
    return;
  }

  os << " "
     << "_BACKTRACE_TRIPLES"
     << " \"";

  bool prependTripleSeparator = false;
  while (!bt.Empty()) {
    const auto& entry = bt.Top();
    if (prependTripleSeparator) {
      os << ";";
    }
    os << entry.FilePath << ";" << entry.Line << ";" << entry.Name;
    bt = bt.Pop();
    prependTripleSeparator = true;
  }

  os << '"';
}